

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ValidPadding::ValidPadding(ValidPadding *this,ValidPadding *from)

{
  ulong uVar1;
  BorderAmounts *from_00;
  BorderAmounts *this_00;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ValidPadding_004b51f8;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  from_00 = from->paddingamounts_;
  if (from_00 == (BorderAmounts *)0x0 || from == (ValidPadding *)_ValidPadding_default_instance_) {
    this_00 = (BorderAmounts *)0x0;
  }
  else {
    this_00 = (BorderAmounts *)operator_new(0x30);
    BorderAmounts::BorderAmounts(this_00,from_00);
  }
  this->paddingamounts_ = this_00;
  return;
}

Assistant:

ValidPadding::ValidPadding(const ValidPadding& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_paddingamounts()) {
    paddingamounts_ = new ::CoreML::Specification::BorderAmounts(*from.paddingamounts_);
  } else {
    paddingamounts_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ValidPadding)
}